

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf-parser.cc
# Opt level: O2

string * __thiscall
elf_parser::Elf_parser::get_relocation_type_abi_cxx11_
          (string *__return_storage_ptr__,Elf_parser *this,uint64_t *rela_type)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch((int)*rela_type) {
  case 1:
    pcVar2 = "R_X86_64_32";
    paVar1 = &local_9;
    break;
  case 2:
    pcVar2 = "R_X86_64_PC32";
    paVar1 = &local_a;
    break;
  default:
    pcVar2 = "OTHERS";
    paVar1 = &local_e;
    break;
  case 5:
    pcVar2 = "R_X86_64_COPY";
    paVar1 = &local_b;
    break;
  case 6:
    pcVar2 = "R_X86_64_GLOB_DAT";
    paVar1 = &local_c;
    break;
  case 7:
    pcVar2 = "R_X86_64_JUMP_SLOT";
    paVar1 = &local_d;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Elf_parser::get_relocation_type(uint64_t &rela_type) {
    switch(ELF64_R_TYPE(rela_type)) {
        case 1: return "R_X86_64_32";
        case 2: return "R_X86_64_PC32";
        case 5: return "R_X86_64_COPY";
        case 6: return "R_X86_64_GLOB_DAT";
        case 7:  return "R_X86_64_JUMP_SLOT";
        default: return "OTHERS";
    }
}